

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  int last;
  char *pcVar7;
  undefined8 uStackY_40;
  REF_LIST ref_list;
  REF_LIST original;
  REF_MPI ref_mpi;
  
  uVar2 = ref_mpi_start(argc,argv);
  if (uVar2 != 0) {
    uVar6 = (ulong)uVar2;
    pcVar7 = "start";
    uStackY_40 = 0x20;
LAB_001021fe:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           uStackY_40,"main",uVar6,pcVar7);
    return (int)uVar6;
  }
  uVar2 = ref_mpi_create(&ref_mpi);
  if (uVar2 != 0) {
    uVar6 = (ulong)uVar2;
    pcVar7 = "make mpi";
    uStackY_40 = 0x21;
    goto LAB_001021fe;
  }
  RVar3 = ref_list_free((REF_LIST)0x0);
  if (RVar3 != 2) {
    lVar4 = (long)RVar3;
    pcVar7 = "dont free NULL";
    uStackY_40 = 0x24;
LAB_00102273:
    uVar5 = uStackY_40;
    uStackY_40 = 2;
    goto LAB_00102278;
  }
  uVar2 = ref_list_create(&ref_list);
  if (uVar2 != 0) {
    uVar6 = (ulong)uVar2;
    pcVar7 = "create";
    uStackY_40 = 0x25;
    goto LAB_001021fe;
  }
  lVar4 = (long)ref_list->n;
  if (lVar4 == 0) {
    uVar2 = ref_list_free(ref_list);
    if (uVar2 != 0) {
      uVar6 = (ulong)uVar2;
      pcVar7 = "free";
      uStackY_40 = 0x27;
      goto LAB_001021fe;
    }
    uVar2 = ref_list_create(&original);
    if (uVar2 != 0) {
      uVar6 = (ulong)uVar2;
      pcVar7 = "create";
      uStackY_40 = 0x2c;
      goto LAB_001021fe;
    }
    uVar2 = ref_list_deep_copy(&ref_list,(REF_LIST)CONCAT44(original._4_4_,(int)original));
    if (uVar2 != 0) {
      uVar6 = (ulong)uVar2;
      pcVar7 = "deep copy";
      uStackY_40 = 0x2d;
      goto LAB_001021fe;
    }
    uVar2 = ref_list_free((REF_LIST)CONCAT44(original._4_4_,(int)original));
    if (uVar2 != 0) {
      uVar6 = (ulong)uVar2;
      pcVar7 = "free";
      uStackY_40 = 0x2e;
      goto LAB_001021fe;
    }
    uVar2 = ref_list_free(ref_list);
    if (uVar2 != 0) {
      uVar6 = (ulong)uVar2;
      pcVar7 = "free";
      uStackY_40 = 0x2f;
      goto LAB_001021fe;
    }
    uVar2 = ref_list_create(&ref_list);
    if (uVar2 != 0) {
      uVar6 = (ulong)uVar2;
      pcVar7 = "create";
      uStackY_40 = 0x34;
      goto LAB_001021fe;
    }
    uVar2 = ref_list_push(ref_list,0x1b);
    if (uVar2 != 0) {
      uVar6 = (ulong)uVar2;
      pcVar7 = "add";
      uStackY_40 = 0x36;
      goto LAB_001021fe;
    }
    lVar4 = (long)ref_list->n;
    if (lVar4 == 1) {
      uVar2 = ref_list_free(ref_list);
      if (uVar2 != 0) {
        uVar6 = (ulong)uVar2;
        pcVar7 = "free";
        uStackY_40 = 0x38;
        goto LAB_001021fe;
      }
      uVar2 = ref_list_create(&ref_list);
      if (uVar2 != 0) {
        uVar6 = (ulong)uVar2;
        pcVar7 = "create";
        uStackY_40 = 0x3d;
        goto LAB_001021fe;
      }
      RVar3 = ref_list_pop(ref_list,(REF_INT *)&original);
      if (RVar3 == 1) {
        uVar2 = ref_list_push(ref_list,0x1b);
        if (uVar2 != 0) {
          uVar6 = (ulong)uVar2;
          pcVar7 = "add";
          uStackY_40 = 0x42;
          goto LAB_001021fe;
        }
        uVar2 = ref_list_pop(ref_list,(REF_INT *)&original);
        if (uVar2 != 0) {
          uVar6 = (ulong)uVar2;
          pcVar7 = "rm";
          uStackY_40 = 0x43;
          goto LAB_001021fe;
        }
        lVar4 = (long)ref_list->n;
        if (lVar4 == 0) {
          uVar2 = ref_list_free(ref_list);
          if (uVar2 == 0) {
            uVar2 = ref_list_create(&ref_list);
            if (uVar2 == 0) {
              iVar1 = ref_list->max;
              last = 0;
              do {
                if (iVar1 < last) {
                  if (ref_list->max <= iVar1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                           ,0x50,"main","more?");
                    return 1;
                  }
                  uVar2 = ref_list_free(ref_list);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "free";
                    uStackY_40 = 0x51;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_create(&ref_list);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "create";
                    uStackY_40 = 0x55;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_push(ref_list,0x14);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "store";
                    uStackY_40 = 0x56;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_push(ref_list,10);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "store";
                    uStackY_40 = 0x57;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_erase(ref_list);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "rm -rf";
                    uStackY_40 = 0x59;
                    goto LAB_001021fe;
                  }
                  lVar4 = (long)ref_list->n;
                  if (lVar4 != 0) {
                    pcVar7 = "has none";
                    uStackY_40 = 0x5b;
                    goto LAB_001022b4;
                  }
                  uVar2 = ref_list_free(ref_list);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "free";
                    uStackY_40 = 0x5d;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_create(&ref_list);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "create";
                    uStackY_40 = 99;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_push(ref_list,0x1b);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "add";
                    uStackY_40 = 0x65;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_contains(ref_list,0x1b,(REF_BOOL *)&original);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "have";
                    uStackY_40 = 0x66;
                    goto LAB_001021fe;
                  }
                  lVar4 = (long)(int)original;
                  if (lVar4 != 1) {
                    pcVar7 = "does have";
                    uStackY_40 = 0x67;
                    goto LAB_0010247f;
                  }
                  uVar2 = ref_list_contains(ref_list,5,(REF_BOOL *)&original);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "have";
                    uStackY_40 = 0x68;
                    goto LAB_001021fe;
                  }
                  lVar4 = (long)(int)original;
                  if (lVar4 != 0) {
                    pcVar7 = "does have";
                    uStackY_40 = 0x69;
                    goto LAB_001022b4;
                  }
                  uVar2 = ref_list_free(ref_list);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "free";
                    uStackY_40 = 0x6a;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_create(&ref_list);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "create";
                    uStackY_40 = 0x6f;
                    goto LAB_001021fe;
                  }
                  RVar3 = ref_list_delete(ref_list,5);
                  if (RVar3 != 5) {
                    lVar4 = (long)RVar3;
                    pcVar7 = "rm";
                    uVar5 = 0x72;
                    uStackY_40 = 5;
                    goto LAB_00102278;
                  }
                  uVar2 = ref_list_push(ref_list,0x15);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "add";
                    uStackY_40 = 0x75;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_push(ref_list,0x16);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "add";
                    uStackY_40 = 0x77;
                    goto LAB_001021fe;
                  }
                  uVar2 = ref_list_push(ref_list,0x17);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "add";
                    uStackY_40 = 0x79;
                    goto LAB_001021fe;
                  }
                  lVar4 = (long)ref_list->n;
                  if (lVar4 != 3) {
                    pcVar7 = "has 3";
                    uVar5 = 0x7a;
                    uStackY_40 = 3;
                    goto LAB_00102278;
                  }
                  uVar2 = ref_list_delete(ref_list,0x15);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "have";
                    uStackY_40 = 0x7d;
                    goto LAB_001021fe;
                  }
                  lVar4 = (long)ref_list->n;
                  if (lVar4 != 2) {
                    pcVar7 = "has 2";
                    uStackY_40 = 0x7e;
                    goto LAB_00102273;
                  }
                  uVar2 = ref_list_delete(ref_list,0x17);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "have";
                    uStackY_40 = 0x81;
                    goto LAB_001021fe;
                  }
                  lVar4 = (long)ref_list->n;
                  if (lVar4 != 1) {
                    pcVar7 = "has 1";
                    uStackY_40 = 1;
                    uVar5 = 0x82;
                    goto LAB_00102278;
                  }
                  uVar2 = ref_list_delete(ref_list,0x16);
                  if (uVar2 != 0) {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "have";
                    uStackY_40 = 0x85;
                    goto LAB_001021fe;
                  }
                  lVar4 = (long)ref_list->n;
                  if (lVar4 != 0) {
                    pcVar7 = "has 0";
                    uStackY_40 = 0x86;
                    goto LAB_001022b4;
                  }
                  uVar2 = ref_list_free(ref_list);
                  if (uVar2 == 0) {
                    uVar2 = ref_mpi_free(ref_mpi);
                    if (uVar2 == 0) {
                      uVar2 = ref_mpi_stop();
                      if (uVar2 == 0) {
                        return 0;
                      }
                      uVar6 = (ulong)uVar2;
                      pcVar7 = "stop";
                      uStackY_40 = 0x8c;
                    }
                    else {
                      uVar6 = (ulong)uVar2;
                      pcVar7 = "mpi free";
                      uStackY_40 = 0x8b;
                    }
                  }
                  else {
                    uVar6 = (ulong)uVar2;
                    pcVar7 = "free";
                    uStackY_40 = 0x88;
                  }
                  goto LAB_001021fe;
                }
                uVar2 = ref_list_push(ref_list,last);
                last = last + 1;
              } while (uVar2 == 0);
              uVar6 = (ulong)uVar2;
              pcVar7 = "store";
              uStackY_40 = 0x4e;
            }
            else {
              uVar6 = (ulong)uVar2;
              pcVar7 = "create";
              uStackY_40 = 0x4b;
            }
          }
          else {
            uVar6 = (ulong)uVar2;
            pcVar7 = "free";
            uStackY_40 = 0x46;
          }
          goto LAB_001021fe;
        }
        pcVar7 = "has none";
        uStackY_40 = 0x44;
        goto LAB_001022b4;
      }
      lVar4 = (long)RVar3;
      pcVar7 = "rm";
      uStackY_40 = 0x3f;
    }
    else {
      pcVar7 = "has one";
      uStackY_40 = 0x37;
    }
LAB_0010247f:
    uVar5 = uStackY_40;
    uStackY_40 = 1;
  }
  else {
    pcVar7 = "init zero";
    uStackY_40 = 0x26;
LAB_001022b4:
    uVar5 = uStackY_40;
    uStackY_40 = 0;
  }
LAB_00102278:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",uVar5
         ,"main",pcVar7,uStackY_40,lVar4);
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
  REF_LIST ref_list;
  REF_MPI ref_mpi;
  RSS(ref_mpi_start(argc, argv), "start");
  RSS(ref_mpi_create(&ref_mpi), "make mpi");

  {
    REIS(REF_NULL, ref_list_free(NULL), "dont free NULL");
    RSS(ref_list_create(&ref_list), "create");
    REIS(0, ref_list_n(ref_list), "init zero");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* deep copy empty */
    REF_LIST original;
    RSS(ref_list_create(&original), "create");
    RSS(ref_list_deep_copy(&ref_list, original), "deep copy");
    RSS(ref_list_free(original), "free");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* store one */
    REF_INT item;
    RSS(ref_list_create(&ref_list), "create");
    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    REIS(1, ref_list_n(ref_list), "has one");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* remove */
    REF_INT item, last;
    RSS(ref_list_create(&ref_list), "create");

    REIS(REF_FAILURE, ref_list_pop(ref_list, &last), "rm");

    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    RSS(ref_list_pop(ref_list, &last), "rm");
    REIS(0, ref_list_n(ref_list), "has none");

    RSS(ref_list_free(ref_list), "free");
  }

  { /* store lots */
    REF_INT item, max;
    RSS(ref_list_create(&ref_list), "create");
    max = ref_list_max(ref_list);
    for (item = 0; item <= max; item++) {
      RSS(ref_list_push(ref_list, item), "store");
    }
    RAS(ref_list_max(ref_list) > max, "more?");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* erase */
    RSS(ref_list_create(&ref_list), "create");
    RSS(ref_list_push(ref_list, 20), "store");
    RSS(ref_list_push(ref_list, 10), "store");

    RSS(ref_list_erase(ref_list), "rm -rf");

    REIS(0, ref_list_n(ref_list), "has none");

    RSS(ref_list_free(ref_list), "free");
  }

  { /* contains */
    REF_INT item;
    REF_BOOL contains;
    RSS(ref_list_create(&ref_list), "create");
    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    RSS(ref_list_contains(ref_list, item, &contains), "have");
    REIS(REF_TRUE, contains, "does have");
    RSS(ref_list_contains(ref_list, 5, &contains), "have");
    REIS(REF_FALSE, contains, "does have");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* delete first */
    REF_INT item;
    RSS(ref_list_create(&ref_list), "create");

    item = 5;
    REIS(REF_NOT_FOUND, ref_list_delete(ref_list, item), "rm");

    item = 21;
    RSS(ref_list_push(ref_list, item), "add");
    item = 22;
    RSS(ref_list_push(ref_list, item), "add");
    item = 23;
    RSS(ref_list_push(ref_list, item), "add");
    REIS(3, ref_list_n(ref_list), "has 3");

    item = 21;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(2, ref_list_n(ref_list), "has 2");

    item = 23;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(1, ref_list_n(ref_list), "has 1");

    item = 22;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(0, ref_list_n(ref_list), "has 0");

    RSS(ref_list_free(ref_list), "free");
  }

  RSS(ref_mpi_free(ref_mpi), "mpi free");
  RSS(ref_mpi_stop(), "stop");

  return 0;
}